

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_cherryhills.c
# Opt level: O3

mraa_board_t * mraa_intel_cherryhills(void)

{
  mraa_board_t *__ptr;
  mraa_pininfo_t *__ptr_00;
  mraa_adv_func_t *pmVar1;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Braswell Cherry Hill";
    __ptr->phy_pin_count = 6;
    __ptr_00 = (mraa_pininfo_t *)malloc(0x11b8);
    __ptr->pins = __ptr_00;
    if (__ptr_00 != (mraa_pininfo_t *)0x0) {
      pmVar1 = (mraa_adv_func_t *)calloc(1,0x288);
      __ptr->adv_func = pmVar1;
      if (pmVar1 != (mraa_adv_func_t *)0x0) {
        builtin_strncpy(__ptr_00->name,"GSUS6",6);
        __ptr_00->name[6] = '\0';
        __ptr_00->name[7] = '\0';
        *(undefined1 *)&__ptr_00->capabilities = 3;
        (__ptr_00->gpio).pinmap = 0x1a0;
        (__ptr_00->gpio).mux_total = 0;
        __ptr_00[1].name[0] = 'G';
        __ptr_00[1].name[1] = 'S';
        __ptr_00[1].name[2] = 'U';
        __ptr_00[1].name[3] = 'S';
        __ptr_00[1].name[4] = '8';
        __ptr_00[1].name[5] = '\0';
        __ptr_00[1].name[6] = '\0';
        __ptr_00[1].name[7] = '\0';
        *(undefined1 *)&__ptr_00[1].capabilities = 3;
        __ptr_00[1].gpio.pinmap = 0x199;
        __ptr_00[1].gpio.mux_total = 0;
        __ptr_00[2].name[0] = 'G';
        __ptr_00[2].name[1] = 'S';
        __ptr_00[2].name[2] = 'U';
        __ptr_00[2].name[3] = 'S';
        __ptr_00[2].name[4] = '7';
        __ptr_00[2].name[5] = '\0';
        __ptr_00[2].name[6] = '\0';
        __ptr_00[2].name[7] = '\0';
        *(undefined1 *)&__ptr_00[2].capabilities = 3;
        __ptr_00[2].gpio.pinmap = 0x19e;
        __ptr_00[2].gpio.mux_total = 0;
        __ptr_00[3].name[0] = 'G';
        __ptr_00[3].name[1] = 'S';
        __ptr_00[3].name[2] = 'U';
        __ptr_00[3].name[3] = 'S';
        __ptr_00[3].name[4] = '0';
        __ptr_00[3].name[5] = '\0';
        __ptr_00[3].name[6] = '\0';
        __ptr_00[3].name[7] = '\0';
        *(undefined1 *)&__ptr_00[3].capabilities = 3;
        __ptr_00[3].gpio.pinmap = 0x196;
        __ptr_00[3].gpio.mux_total = 0;
        __ptr_00[4].name[0] = 'G';
        __ptr_00[4].name[1] = 'S';
        __ptr_00[4].name[2] = 'U';
        __ptr_00[4].name[3] = 'S';
        __ptr_00[4].name[4] = '1';
        __ptr_00[4].name[5] = '\0';
        __ptr_00[4].name[6] = '\0';
        __ptr_00[4].name[7] = '\0';
        *(undefined1 *)&__ptr_00[4].capabilities = 3;
        __ptr_00[4].gpio.pinmap = 0x19a;
        __ptr_00[4].gpio.mux_total = 0;
        return __ptr;
      }
      free(__ptr_00);
    }
    syslog(2,"Cherryhills(Braswell): Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_cherryhills()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = MRAA_INTEL_CHERRYHILLS_PINCOUNT;
    b->aio_count = 0;
    b->adc_raw = 0;
    b->adc_supported = 0;

    b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_INTEL_CHERRYHILLS_PINCOUNT);
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    int pos = 0;
    //Physical header where these pins are: J3E5
    strncpy(b->pins[pos].name, "GSUS6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 416;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 409;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 414;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    //Physical header where these pins are: J3E3
    strncpy(b->pins[pos].name, "GSUS0", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 406;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 410;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    return b;
error:
    syslog(LOG_CRIT, "Cherryhills(Braswell): Platform failed to initialise");
    free(b);
    return NULL;
}